

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O1

ssize_t amqp_ssl_socket_recv(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  ssize_t sVar2;
  
  ERR_clear_error();
  *(undefined4 *)((long)base + 0x34) = 0;
  iVar1 = SSL_read(*(SSL **)((long)base + 0x18),buf,(int)len);
  if (iVar1 < 1) {
    iVar1 = SSL_get_error(*(SSL **)((long)base + 0x18),iVar1);
    *(int *)((long)base + 0x34) = iVar1;
    sVar2 = -0x200;
    if (iVar1 == 6) {
      sVar2 = -7;
    }
  }
  else {
    sVar2 = (ssize_t)iVar1;
  }
  return sVar2;
}

Assistant:

static ssize_t
amqp_ssl_socket_recv(void *base,
                     void *buf,
                     size_t len,
                     AMQP_UNUSED int flags)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t received;
  ERR_clear_error();
  self->internal_error = 0;

  received = SSL_read(self->ssl, buf, len);
  if (0 >= received) {
    self->internal_error = SSL_get_error(self->ssl, received);
    switch(self->internal_error) {
    case SSL_ERROR_ZERO_RETURN:
      received = AMQP_STATUS_CONNECTION_CLOSED;
      break;
    default:
      received = AMQP_STATUS_SSL_ERROR;
      break;
    }
  }

  return received;
}